

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl.c
# Opt level: O0

void yajl_free(yajl_handle handle)

{
  long in_RDI;
  
  if (*(long *)(in_RDI + 0x30) != 0) {
    (**(code **)(*(long *)(in_RDI + 0x48) + 0x10))
              (*(undefined8 *)(*(long *)(in_RDI + 0x48) + 0x18),*(undefined8 *)(in_RDI + 0x30));
  }
  yajl_buf_free((yajl_buf)0x102e0f);
  if (*(long *)(in_RDI + 0x10) != 0) {
    yajl_lex_free((yajl_lexer)0x102e27);
    *(undefined8 *)(in_RDI + 0x10) = 0;
  }
  (**(code **)(in_RDI + 0x60))(*(undefined8 *)(in_RDI + 0x68),in_RDI);
  return;
}

Assistant:

void
yajl_free(yajl_handle handle)
{
    yajl_bs_free(handle->stateStack);
    yajl_buf_free(handle->decodeBuf);
    if (handle->lexer) {
        yajl_lex_free(handle->lexer);
        handle->lexer = NULL;
    }
    YA_FREE(&(handle->alloc), handle);
}